

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

void vec4_normalize_this(vec4 v)

{
  float __x;
  
  __x = v.w * v.w + v.z * v.z + v.x * v.x + v.y * v.y;
  if (0.0 <= __x) {
    return;
  }
  sqrtf(__x);
  return;
}

Assistant:

void vec4_normalize_this(vec4 v) {
    float l = sqrtf(v.x * v.x + v.y * v.y + v.z * v.z + v.w * v.w);
    if (l != 0) {
        v.x /= l;
        v.y /= l;
        v.z /= l;
        v.w /= l;
    }
}